

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_error.hpp
# Opt level: O0

void __thiscall tao::pegtl::parse_error::parse_error(parse_error *this,string *msg,position *pos)

{
  allocator_type *in_RDX;
  runtime_error *in_RDI;
  position *in_stack_000000e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  value_type *__value;
  vector<tao::pegtl::position,_std::allocator<tao::pegtl::position>_> *this_00;
  undefined1 local_85 [13];
  vector<tao::pegtl::position,_std::allocator<tao::pegtl::position>_> local_78;
  string local_58 [32];
  string local_38 [32];
  allocator_type *local_18;
  
  this_00 = &local_78;
  local_18 = in_RDX;
  to_string_abi_cxx11_(in_stack_000000e8);
  std::operator+(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50);
  std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::runtime_error::runtime_error(in_RDI,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&local_78);
  *(undefined ***)in_RDI = &PTR__parse_error_003a5708;
  __value = (value_type *)local_85;
  std::allocator<tao::pegtl::position>::allocator((allocator<tao::pegtl::position> *)0x23f080);
  std::vector<tao::pegtl::position,_std::allocator<tao::pegtl::position>_>::vector
            (this_00,(size_type)in_RDI,__value,local_18);
  std::allocator<tao::pegtl::position>::~allocator((allocator<tao::pegtl::position> *)0x23f0a5);
  return;
}

Assistant:

parse_error( const std::string& msg, const position& pos )
            : std::runtime_error( to_string( pos ) + ": " + msg ),
              positions( 1, pos )
         {
         }